

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::DefaultsTest::iterate(DefaultsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  char *description;
  byte bVar9;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint texture;
  GLint value_dst;
  undefined4 uStack_64;
  undefined8 uStack_60;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  GLfloat value_dst_2 [4];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    (**(code **)(lVar8 + 0x400))(0x806f,1);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x187a);
    value_dst = 0;
    (**(code **)(lVar8 + 0xb08))(0,0x90ea);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1882);
    bVar1 = CompareAndLog(this,0x1902,value_dst,0x90ea);
    _value_dst = CONCAT44(uStack_64,1);
    (**(code **)(lVar8 + 0xb08))(0,0x813c);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x188d);
    bVar2 = CompareAndLog(this,0,value_dst,0x813c);
    _value_dst = 0;
    uStack_60 = 0;
    value_dst_2[0] = 0.0;
    value_dst_2[1] = 0.0;
    value_dst_2[2] = 0.0;
    value_dst_2[3] = 0.0;
    (**(code **)(lVar8 + 0xb00))(0,0x1004);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1898);
    bVar3 = CompareAndLog(this,(GLfloat *)&value_dst,value_dst_2,0x1004);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x884d);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18a3);
    bVar4 = CompareAndLog(this,0x203,value_dst,0x884d);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x884c);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18ae);
    local_49 = CompareAndLog(this,0,value_dst,0x884c);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb00))(0,0x8501);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18b9);
    local_4a = CompareAndLog(this,0.0,(GLfloat)value_dst,0x8501);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x2801);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18c4);
    local_4b = CompareAndLog(this,0x2702,value_dst,0x2801);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x2800);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18cf);
    local_4c = CompareAndLog(this,0x2601,value_dst,0x2800);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x813a);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18da);
    local_4d = CompareAndLog(this,-1000,value_dst,0x813a);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x813b);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18e5);
    local_4e = CompareAndLog(this,1000,value_dst,0x813b);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x813d);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18f0);
    local_4f = CompareAndLog(this,1000,value_dst,0x813d);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x8e42);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x18fb);
    local_50 = CompareAndLog(this,0x1903,value_dst,0x8e42);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x8e43);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1906);
    local_51 = CompareAndLog(this,0x1904,value_dst,0x8e43);
    _value_dst = _value_dst & 0xffffffff00000000;
    (**(code **)(lVar8 + 0xb08))(0,0x8e44);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1911);
    local_52 = CompareAndLog(this,0x1905,value_dst,0x8e44);
    _value_dst = _value_dst & 0xffffffff00000000;
    local_54 = bVar4;
    local_53 = bVar3;
    (**(code **)(lVar8 + 0xb08))(0,0x8e45);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x191c);
    local_55 = CompareAndLog(this,0x1906,value_dst,0x8e45);
    value_dst = 0xb;
    (**(code **)(lVar8 + 0xb08))(0,0x2802);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1927);
    bVar3 = CompareAndLog(this,0x2901,value_dst,0x2802);
    value_dst = 0xb;
    (**(code **)(lVar8 + 0xb08))(0,0x2803);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1932);
    bVar4 = CompareAndLog(this,0x2901,value_dst,0x2803);
    _value_dst = CONCAT44(uStack_64,0xb);
    (**(code **)(lVar8 + 0xb08))(0,0x8072);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"glGetTextureParameter has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x193d);
    bVar5 = CompareAndLog(this,0x2901,value_dst,0x8072);
    bVar9 = (bVar1 && bVar2) & local_53 & local_54 & local_49 & local_4a & local_4b & local_4c &
            local_4d & local_4e & local_4f & local_50 & local_51 & local_52 & local_55;
    do {
      iVar6 = (**(code **)(lVar8 + 0x800))();
    } while (iVar6 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar9 & bVar3 & bVar4 & bVar5) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Texture. */
	glw::GLuint texture = 0;

	try
	{
		gl.createTextures(GL_TEXTURE_3D, 1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		{
			glw::GLenum name	  = GL_DEPTH_STENCIL_TEXTURE_MODE;
			glw::GLint  value_ref = GL_DEPTH_COMPONENT;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_BASE_LEVEL;
			glw::GLint  value_ref = 0;
			glw::GLint  value_dst = 1;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum  name		  = GL_TEXTURE_BORDER_COLOR;
			glw::GLfloat value_ref[4] = { 0.f, 0.f, 0.f, 0.f };
			glw::GLfloat value_dst[4] = {};

			gl.getTextureParameterfv(texture, name, value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_FUNC;
			glw::GLint  value_ref = GL_LEQUAL;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_MODE;
			glw::GLint  value_ref = GL_NONE;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum  name	  = GL_TEXTURE_LOD_BIAS;
			glw::GLfloat value_ref = 0.f;
			glw::GLfloat value_dst = 0.f;

			gl.getTextureParameterfv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_FILTER;
			glw::GLint  value_ref = GL_NEAREST_MIPMAP_LINEAR;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAG_FILTER;
			glw::GLint  value_ref = GL_LINEAR;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_LOD;
			glw::GLint  value_ref = -1000;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LOD;
			glw::GLint  value_ref = 1000;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LEVEL;
			glw::GLint  value_ref = 1000;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_R;
			glw::GLint  value_ref = GL_RED;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_G;
			glw::GLint  value_ref = GL_GREEN;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_B;
			glw::GLint  value_ref = GL_BLUE;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_A;
			glw::GLint  value_ref = GL_ALPHA;
			glw::GLint  value_dst = 0;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_S;
			glw::GLint  value_ref = GL_REPEAT;
			glw::GLint  value_dst = 11;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_T;
			glw::GLint  value_ref = GL_REPEAT;
			glw::GLint  value_dst = 11;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_R;
			glw::GLint  value_ref = GL_REPEAT;
			glw::GLint  value_dst = 11;

			gl.getTextureParameteriv(texture, name, &value_dst);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTextureParameter has failed");

			is_ok &= CompareAndLog(value_ref, value_dst, name);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}